

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.h
# Opt level: O1

void __thiscall ON_4fPointArray::~ON_4fPointArray(ON_4fPointArray *this)

{
  ON_SimpleArray<ON_4fPoint>::~ON_SimpleArray(&this->super_ON_SimpleArray<ON_4fPoint>);
  operator_delete(this,0x18);
  return;
}

Assistant:

class ON_CLASS ON_4fPointArray : public ON_SimpleArray<ON_4fPoint>
{
public:
  // see ON_SimpleArray class definition comments for constructor documentation
  ON_4fPointArray();
  ON_4fPointArray(int);
  ON_4fPointArray(const ON_4fPointArray&);
  ON_4fPointArray& operator=( const ON_4fPointArray& );

  bool Transform( const ON_Xform& );
  bool SwapCoordinates(int,int);
}